

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

bool __thiscall
SVGChart::LinTickIterator::InitFromRanges
          (LinTickIterator *this,float inParRange,float inOrthoScreenRange,float inDivGuess,
          TickInfo *ioTickInfo)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  float fVar5;
  
  if (inDivGuess <= 1e-20) {
    bVar1 = false;
  }
  else {
    fVar5 = TickInfo::RoundSpan(inParRange / inDivGuess);
    bVar1 = 0.0 <= fVar5;
    if (0.0 <= fVar5) {
      uVar4 = -(uint)(inParRange / fVar5 < 1.0);
      ioTickInfo->mMajorTickSpan = (float)(~uVar4 & (uint)fVar5 | (uint)inParRange & uVar4);
      ioTickInfo->mTickDivision = 5;
      if (ioTickInfo->mAutoTickSize == true) {
        fVar5 = floorf(inOrthoScreenRange * 0.01 + 0.5);
        iVar2 = 1;
        if (1 < (int)fVar5) {
          iVar2 = (int)fVar5;
        }
        ioTickInfo->mMinorTickScreenSize = iVar2;
        fVar5 = floorf(inOrthoScreenRange * 0.02 + 0.5);
        iVar3 = iVar2 + 1;
        if (iVar2 + 1 <= (int)fVar5) {
          iVar3 = (int)fVar5;
        }
        ioTickInfo->mMajorTickScreenSize = iVar3;
      }
      TickInfo::MakeFormatString(ioTickInfo->mMajorTickSpan,&ioTickInfo->mFormatString);
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool LinTickIterator::InitFromRanges (float inParRange, float inOrthoScreenRange, float inDivGuess, TickInfo &ioTickInfo) const {
      if (inDivGuess <= kFloatSmall) {
        return false;
      }
      float thePreferredSpan = TickInfo::RoundSpan (inParRange/inDivGuess);
      if (thePreferredSpan < 0) {
        return false;
      }

      float thePreferredNrOfTicks = inParRange/thePreferredSpan;
      if (thePreferredNrOfTicks <1) {
        ioTickInfo.mMajorTickSpan = inParRange;
      }
      else {
        ioTickInfo.mMajorTickSpan = thePreferredSpan;
      }

      ioTickInfo.mTickDivision = 5;
      if (ioTickInfo.mAutoTickSize) {
          ioTickInfo.mMinorTickScreenSize = PMax (kMinMinorTickScreenSize, PPlot::Round (inOrthoScreenRange*kRelMinorTickSize));
          ioTickInfo.mMajorTickScreenSize = PMax (ioTickInfo.mMinorTickScreenSize+1, PPlot::Round (inOrthoScreenRange*kRelMajorTickSize));
      }

      TickInfo::MakeFormatString (ioTickInfo.mMajorTickSpan, ioTickInfo.mFormatString);
      return true;
    }